

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

bool __thiscall
wasm::anon_unknown_22::EscapeAnalyzer::escapes(EscapeAnalyzer *this,Expression *allocation)

{
  ParentChildInteraction PVar1;
  bool bVar2;
  SetInfluences *this_00;
  reference ppLVar3;
  reference pNVar4;
  mapped_type *pmVar5;
  pair<wasm::Expression_*,_wasm::Expression_*> pVar6;
  Expression *local_210;
  pair<wasm::Expression_*,_wasm::Expression_*> local_208;
  size_t sStack_1f8;
  Name name;
  _Self local_1e0;
  iterator __end3;
  iterator __begin3;
  NameSet *__range3;
  pair<wasm::Expression_*,_wasm::Expression_*> local_190;
  value_type local_180;
  LocalGet *get;
  const_iterator __end4;
  const_iterator __begin4;
  SetInfluences *__range4;
  LocalSet *local_150;
  LocalSet *set;
  pair<wasm::Expression_*,_wasm::Expression_*> local_140;
  undefined4 local_130;
  ParentChildInteraction local_129;
  Expression *pEStack_128;
  ParentChildInteraction interaction;
  Expression *parent;
  Expression *child;
  pair<wasm::Expression_*,_wasm::Expression_*> flow;
  Expression *local_f8;
  pair<wasm::Expression_*,_wasm::Expression_*> local_f0;
  undefined1 local_e0 [8];
  UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> flows;
  Expression *allocation_local;
  EscapeAnalyzer *this_local;
  
  flows.processed._M_h._M_single_bucket = (__node_base_ptr)allocation;
  UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::
  UniqueNonrepeatingDeferredQueue
            ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *)
             local_e0);
  local_f8 = Parents::getParent(this->parents,(Expression *)flows.processed._M_h._M_single_bucket);
  std::pair<wasm::Expression_*,_wasm::Expression_*>::
  pair<wasm::Expression_*&,_wasm::Expression_*,_true>
            (&local_f0,(Expression **)&flows.processed._M_h._M_single_bucket,&local_f8);
  UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::push
            ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *)
             local_e0,local_f0);
  do {
    bVar2 = UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::empty
                      ((UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *)
                       local_e0);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      bVar2 = getsAreExclusiveToSets(this);
      if (bVar2) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
LAB_01d0cca1:
      local_130 = 1;
      UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::
      ~UniqueNonrepeatingDeferredQueue
                ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                  *)local_e0);
      return this_local._7_1_;
    }
    pVar6 = UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::pop
                      ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                        *)local_e0);
    pEStack_128 = pVar6.second;
    parent = pVar6.first;
    child = parent;
    flow.first = pEStack_128;
    local_129 = getParentChildInteraction
                          (this,(Expression *)flows.processed._M_h._M_single_bucket,pEStack_128,
                           parent);
    if ((local_129 == Escapes) || (local_129 == Mixes)) {
      this_local._7_1_ = true;
      goto LAB_01d0cca1;
    }
    if (local_129 != FullyConsumes && local_129 != Flows) {
      __assert_fail("interaction == ParentChildInteraction::FullyConsumes || interaction == ParentChildInteraction::Flows"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                    ,0x10b,"bool wasm::(anonymous namespace)::EscapeAnalyzer::escapes(Expression *)"
                   );
    }
    if (local_129 == Flows) {
      set = (LocalSet *)Parents::getParent(this->parents,pEStack_128);
      std::pair<wasm::Expression_*,_wasm::Expression_*>::
      pair<wasm::Expression_*&,_wasm::Expression_*,_true>
                (&local_140,&stack0xfffffffffffffed8,(Expression **)&set);
      UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::push
                ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                  *)local_e0,local_140);
    }
    local_150 = Expression::dynCast<wasm::LocalSet>(pEStack_128);
    if (local_150 != (LocalSet *)0x0) {
      std::
      unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
      ::insert(&this->sets,&local_150);
      this_00 = LazyLocalGraph::getSetInfluences(this->localGraph,local_150);
      __end4 = std::
               unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
               ::begin(this_00);
      get = (LocalGet *)
            std::
            unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
            ::end(this_00);
      while (bVar2 = std::__detail::operator!=
                               (&__end4.super__Node_iterator_base<wasm::LocalGet_*,_false>,
                                (_Node_iterator_base<wasm::LocalGet_*,_false> *)&get), bVar2) {
        ppLVar3 = std::__detail::_Node_const_iterator<wasm::LocalGet_*,_true,_false>::operator*
                            (&__end4);
        local_180 = *ppLVar3;
        __range3 = (NameSet *)Parents::getParent(this->parents,(Expression *)local_180);
        std::pair<wasm::Expression_*,_wasm::Expression_*>::
        pair<wasm::LocalGet_*&,_wasm::Expression_*,_true>
                  (&local_190,&local_180,(Expression **)&__range3);
        UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::push
                  ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                    *)local_e0,local_190);
        std::__detail::_Node_const_iterator<wasm::LocalGet_*,_true,_false>::operator++(&__end4);
      }
    }
    branchesSentByParent((NameSet *)&__begin3,this,parent,pEStack_128);
    __end3 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::begin
                       ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                        &__begin3);
    local_1e0._M_node =
         (_Base_ptr)
         std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::end
                   ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&__begin3
                   );
    while (bVar2 = std::operator!=(&__end3,&local_1e0), bVar2) {
      pNVar4 = std::_Rb_tree_const_iterator<wasm::Name>::operator*(&__end3);
      sStack_1f8 = (pNVar4->super_IString).str._M_len;
      name.super_IString.str._M_len = (size_t)(pNVar4->super_IString).str._M_str;
      local_210 = BranchUtils::BranchTargets::getTarget
                            (this->branchTargets,(Name)(pNVar4->super_IString).str);
      std::pair<wasm::Expression_*,_wasm::Expression_*>::
      pair<wasm::Expression_*&,_wasm::Expression_*,_true>(&local_208,&parent,&local_210);
      UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::push
                ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                  *)local_e0,local_208);
      std::_Rb_tree_const_iterator<wasm::Name>::operator++(&__end3);
    }
    local_130 = 6;
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
              ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&__begin3);
    pmVar5 = std::
             unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
             ::operator[](&this->reachedInteractions,&parent);
    PVar1 = local_129;
    *pmVar5 = Flows;
    pmVar5 = std::
             unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
             ::operator[](&this->reachedInteractions,&stack0xfffffffffffffed8);
    *pmVar5 = PVar1;
  } while( true );
}

Assistant:

bool escapes(Expression* allocation) {
    // A queue of flows from children to parents. When something is in the queue
    // here then it assumed that it is ok for the allocation to be at the child
    // (that is, we have already checked the child before placing it in the
    // queue), and we need to check if it is ok to be at the parent, and to flow
    // from the child to the parent. We will analyze that (see
    // ParentChildInteraction, above) and continue accordingly.
    using ChildAndParent = std::pair<Expression*, Expression*>;
    UniqueNonrepeatingDeferredQueue<ChildAndParent> flows;

    // Start the flow from the allocation itself to its parent.
    flows.push({allocation, parents.getParent(allocation)});

    // Keep flowing while we can.
    while (!flows.empty()) {
      auto flow = flows.pop();
      auto* child = flow.first;
      auto* parent = flow.second;

      auto interaction = getParentChildInteraction(allocation, parent, child);
      if (interaction == ParentChildInteraction::Escapes ||
          interaction == ParentChildInteraction::Mixes) {
        // If the parent may let us escape, or the parent mixes other values
        // up with us, give up.
        return true;
      }

      // The parent either fully consumes us, or flows us onwards; either way,
      // we can proceed here, hopefully.
      assert(interaction == ParentChildInteraction::FullyConsumes ||
             interaction == ParentChildInteraction::Flows);

      // We can proceed, as the parent interacts with us properly, and we are
      // the only allocation to get here.

      if (interaction == ParentChildInteraction::Flows) {
        // The value flows through the parent; we need to look further at the
        // grandparent.
        flows.push({parent, parents.getParent(parent)});
      }

      if (auto* set = parent->dynCast<LocalSet>()) {
        // This is one of the sets we are written to, and so we must check for
        // exclusive use of our allocation by all the gets that read the value.
        // Note the set, and we will check the gets at the end once we know all
        // of our sets.
        sets.insert(set);

        // We must also look at how the value flows from those gets.
        for (auto* get : localGraph.getSetInfluences(set)) {
          flows.push({get, parents.getParent(get)});
        }
      }

      // If the parent may send us on a branch, we will need to look at the flow
      // to the branch target(s).
      for (auto name : branchesSentByParent(child, parent)) {
        flows.push({child, branchTargets.getTarget(name)});
      }

      // If we got to here, then we can continue to hope that we can optimize
      // this allocation. Mark the parent and child as reached by it, and
      // continue. The child flows the value to the parent, and the parent's
      // behavior was computed before.
      reachedInteractions[child] = ParentChildInteraction::Flows;
      reachedInteractions[parent] = interaction;
    }

    // We finished the loop over the flows. Do the final checks.
    if (!getsAreExclusiveToSets()) {
      return true;
    }

    // Nothing escapes, hurray!
    return false;
  }